

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedList.cpp
# Opt level: O2

ostream * operator<<(ostream *output,LinkedList *list)

{
  Node *pNVar1;
  ostream *poVar2;
  Node **ppNVar3;
  
  ppNVar3 = &list->start;
  while (pNVar1 = *ppNVar3, pNVar1 != (Node *)0x0) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)output,pNVar1->index);
    poVar2 = std::operator<<(poVar2,"> ");
    poVar2 = std::operator<<(poVar2,(string *)&pNVar1->data);
    std::endl<char,std::char_traits<char>>(poVar2);
    ppNVar3 = &pNVar1->next;
  }
  return output;
}

Assistant:

std::ostream &operator<<(std::ostream &output, LinkedList &list) {

    Node* node = list.start;

    // Print line number followed by the node's string data and end the line
    while (node != nullptr) {
        output << node->index << "> " << node->data << std::endl;

        node = node->next;
    }
    return output;  // chain them together like strings
}